

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

kMethod * LookupOverloadedMethod(KonohaContext *kctx,kMethod *mtd,kNode *expr,kNameSpace *ns)

{
  ksymbol_t symbol;
  uintptr_t uVar1;
  KKeyValue *pKVar2;
  long lVar3;
  code *pcVar4;
  KonohaLib *pKVar5;
  _func_kNode_ptr_KonohaContext_ptr_kNode_ptr_size_t_kNameSpace_ptr_KClass_ptr_int *p_Var6;
  _func_kparamId_t_KonohaContext_ptr_kuhalfword_t_kparamtype_t_ptr *p_Var7;
  undefined8 uVar8;
  long lVar9;
  kparamtype_t kVar10;
  kNameSpace *pkVar11;
  kparamtype_t *pkVar12;
  kparamId_t paramdom;
  KClass *pKVar13;
  kNode *pkVar14;
  kMethod *pkVar15;
  kuhalfword_t paramsize;
  ulong uVar16;
  ulong uVar17;
  kparamtype_t akStack_70 [4];
  kMethod *local_50;
  kNameSpace *local_48;
  kparamtype_t *local_40;
  KClass *local_38;
  
  local_48 = ns;
  akStack_70[3] = (kparamtype_t)expr;
  local_38 = *(KClass **)
              ((kctx->share->classTable).field_1.bytebuf +
              (ulong)(*(uint *)((((expr->field_5).NodeList)->field_2).unboxItems[1] + 0x1c) &
                     0xfffffff) * 8);
  uVar16 = ((expr->field_5).NodeList)->bytesize >> 3;
  uVar17 = uVar16 - 2;
  lVar9 = -(uVar16 * 8 - 1 & 0xfffffffffffffff0);
  local_40 = (kparamtype_t *)((long)akStack_70 + lVar9 + 0x18);
  local_50 = mtd;
  uVar1 = (kctx->share->paramList->field_2).unboxItems[mtd->paramid];
  uVar16 = 0;
  while( true ) {
    pKVar13 = local_38;
    pkVar12 = local_40;
    if (uVar17 == uVar16) {
      paramsize = (kuhalfword_t)uVar17;
      p_Var7 = kctx->klib->Kparamdom;
      *(undefined8 *)((long)akStack_70 + lVar9 + 0x10) = 0x11739e;
      paramdom = (*p_Var7)(kctx,paramsize,pkVar12);
      pKVar13 = local_38;
      pkVar11 = local_48;
      symbol = local_50->mn;
      *(kparamtype_t **)((long)akStack_70 + lVar9 + 8) = pkVar12;
      *(undefined8 *)((long)akStack_70 + lVar9) = 0x1173c0;
      pkVar15 = kNameSpace_GetMethodBySignatureNULL
                          (kctx,pkVar11,pKVar13,symbol,paramdom,paramsize,
                           *(kparamtype_t **)((long)akStack_70 + lVar9 + 8));
      return pkVar15;
    }
    pKVar2 = (kctx->share->classTable).field_1.keyValueItems;
    if (uVar16 < *(uint *)(uVar1 + 0x1c)) {
      lVar3 = *(long *)(&pKVar2->key + (ulong)(*(uint *)(uVar1 + 0x20 + uVar16 * 8) & 0xfffffff) * 2
                       );
      pcVar4 = *(code **)(lVar3 + 0x50);
      *(undefined8 *)((long)akStack_70 + lVar9 + 0x10) = 0x117345;
      pKVar13 = (KClass *)(*pcVar4)(kctx,lVar3,pKVar13);
    }
    else {
      pKVar13 = (KClass *)(pKVar2->field_2).unboxValue;
    }
    pkVar11 = local_48;
    kVar10 = akStack_70[3];
    pKVar5 = kctx->klib;
    *(undefined8 *)((long)akStack_70 + lVar9 + 0x10) = 1;
    uVar8 = *(undefined8 *)((long)akStack_70 + lVar9 + 0x10);
    p_Var6 = pKVar5->TypeCheckNodeAt;
    *(undefined8 *)((long)akStack_70 + lVar9 + 0x10) = 0x11736e;
    pkVar14 = (*p_Var6)(kctx,(kNode *)kVar10,uVar16 + 2,pkVar11,pKVar13,(int)uVar8);
    if (pkVar14->nodeType == 0x18) break;
    local_40[uVar16].typeAttr = pkVar14->typeAttr;
    uVar16 = uVar16 + 1;
  }
  return (kMethod *)0x0;
}

Assistant:

static kMethod *LookupOverloadedMethod(KonohaContext *kctx, kMethod *mtd, kNode *expr, kNameSpace *ns)
{
	KClass *thisClass = KClass_(expr->NodeList->NodeItems[1]->typeAttr);
	size_t i, psize = kArray_size(expr->NodeList) - 2;
	kparamtype_t *p = ALLOCA(kparamtype_t, psize);
	kParam *pa = kMethod_GetParam(mtd);
	for(i = 0; i < psize; i++) {
		size_t n = i + 2;
		KClass *paramType = (i < pa->psize) ? ResolveTypeVariable(kctx, KClass_(pa->paramtypeItems[i].typeAttr), thisClass) : KClass_INFER;
		kNode *texpr = KLIB TypeCheckNodeAt(kctx, expr, n, ns, paramType, TypeCheckPolicy_NoCheck);
		if(kNode_IsError(texpr)) return NULL;
		p[i].typeAttr = texpr->typeAttr;
	}
	kparamId_t paramdom = KLIB Kparamdom(kctx, psize, p);
	return kNameSpace_GetMethodBySignatureNULL(kctx, ns, thisClass, mtd->mn, paramdom, psize, p);
}